

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void spirv_cross::inner::join_helper<char_const*&,std::__cxx11::string,std::__cxx11::string>
               (StringStream<4096UL,_4096UL> *stream,char **t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  char **t_local;
  StringStream<4096UL,_4096UL> *stream_local;
  
  StringStream<4096UL,_4096UL>::operator<<(stream,*t);
  join_helper<std::__cxx11::string,std::__cxx11::string>(stream,ts,ts_1);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}